

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O0

bool __thiscall ON_BinaryArchive::ReadObjectUserData(ON_BinaryArchive *this,ON_Object *object)

{
  ON_UUID item_id;
  ON_UUID application_id;
  undefined8 uVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  size_t sVar5;
  ON_Object *p;
  ON_UserData *this_00;
  ON_UnknownUserData *pOVar6;
  uchar extraout_RDX [8];
  uchar extraout_RDX_00 [8];
  ON_UUID uuid;
  ON_UUID uuid_00;
  byte local_1b9;
  bool bReadUserData;
  ON_UnknownUserData *uud;
  ON_Object *tmp;
  ON_ClassId *local_168;
  ON_ClassId *udId;
  ON_UserData *ud;
  ON__UINT32 local_134;
  ON__UINT64 OStack_130;
  ON__UINT32 t;
  ON__INT64 length_TCODE_ANONYMOUS_CHUNK;
  CUserDataHeaderInfo ud_header;
  int local_60;
  int minor_userdata_version;
  int major_userdata_version;
  int local_4c;
  undefined1 local_48 [8];
  ON_ReadChunkHelper ch;
  bool bChunkReadSuccess;
  bool rc;
  ON_Object *object_local;
  ON_BinaryArchive *this_local;
  
  ch._39_1_ = 1;
  ch._38_1_ = 1;
  do {
    local_1b9 = 0;
    if ((ch._39_1_ & 1) != 0) {
      local_1b9 = ch._38_1_;
    }
    if ((local_1b9 & 1) == 0) break;
    ON_ReadChunkHelper::ON_ReadChunkHelper
              ((ON_ReadChunkHelper *)local_48,this,(bool *)&ch.field_0x26);
    uVar1 = ch._8_8_;
    if ((ch._38_1_ & 1) == 0) {
      ch._39_1_ = 0;
      local_4c = 3;
    }
    else if ((int)ch.m_binary_archive == -0x7ffd8001) {
      local_4c = 3;
    }
    else if ((int)ch.m_binary_archive == 0x27ffd) {
      sVar5 = SizeofChunkLength(this);
      if ((long)uVar1 < (long)(sVar5 * 4 + 8)) {
        ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_archive.cpp"
                   ,0x15b3,"","TCODE_OPENNURBS_CLASS_USERDATA chunk is too short");
        local_4c = 2;
      }
      else {
        local_60 = 0;
        ud_header.m_xform.m_xform[3][3]._4_4_ = 0;
        ch._39_1_ = Read3dmChunkVersion(this,&local_60,
                                        (int *)((long)ud_header.m_xform.m_xform[3] + 0x1c));
        if ((bool)ch._39_1_) {
          if ((local_60 < 1) || (2 < local_60)) {
            local_4c = 2;
          }
          else {
            CUserDataHeaderInfo::CUserDataHeaderInfo
                      ((CUserDataHeaderInfo *)&length_TCODE_ANONYMOUS_CHUNK);
            ch._39_1_ = ReadObjectUserDataHeaderHelper
                                  (this,local_60,ud_header.m_xform.m_xform[3][3]._4_4_,
                                   (CUserDataHeaderInfo *)&length_TCODE_ANONYMOUS_CHUNK);
            if ((bool)ch._39_1_) {
              OStack_130 = 0;
              local_134 = 0;
              ch._39_1_ = PeekAt3dmBigChunkType
                                    (this,&local_134,(ON__INT64 *)&stack0xfffffffffffffed0);
              if ((bool)ch._39_1_) {
                if (local_134 == 0x40008000) {
                  if ((long)OStack_130 < 4) {
                    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_archive.cpp"
                               ,0x15df,"",
                               "Reading object user data - length of TCODE_ANONYMOUS_CHUNK < 4");
                    ch._39_1_ = 0;
                  }
                }
                else {
                  ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_archive.cpp"
                             ,0x15d9,"",
                             "Reading object user data - unable to find TCODE_ANONYMOUS_CHUNK");
                  ch._39_1_ = 0;
                }
              }
              if (ch._39_1_ == '\0') {
                local_4c = 3;
              }
              else {
                application_id.Data4 = (uchar  [8])ud_header.m_appid._0_8_;
                application_id._0_8_ = ud_header.m_itemid.Data4;
                item_id.Data4 = (uchar  [8])ud_header.m_itemid._0_8_;
                item_id._0_8_ = ud_header.m_classid.Data4;
                bVar2 = ShouldSerializeUserDataItem(this,application_id,item_id);
                if (bVar2) {
                  uuid.Data4[0] = extraout_RDX[0];
                  uuid.Data4[1] = extraout_RDX[1];
                  uuid.Data4[2] = extraout_RDX[2];
                  uuid.Data4[3] = extraout_RDX[3];
                  uuid.Data4[4] = extraout_RDX[4];
                  uuid.Data4[5] = extraout_RDX[5];
                  uuid.Data4[6] = extraout_RDX[6];
                  uuid.Data4[7] = extraout_RDX[7];
                  uuid.Data1 = ud_header.m_classid.Data1;
                  uuid.Data2 = ud_header.m_classid.Data2;
                  uuid.Data3 = ud_header.m_classid.Data3;
                  local_168 = ON_ClassId::ClassId((ON_ClassId *)length_TCODE_ANONYMOUS_CHUNK,uuid);
                  if (local_168 == (ON_ClassId *)0x0) {
                    bVar2 = ON_UuidIsNil((ON_UUID *)ud_header.m_itemid.Data4);
                    if ((!bVar2) &&
                       (iVar3 = (*this->_vptr_ON_BinaryArchive[9])
                                          (this,ud_header.m_itemid.Data4,ud_header.m_appid._0_8_),
                       iVar3 == 1)) {
                      uuid_00.Data4[0] = extraout_RDX_00[0];
                      uuid_00.Data4[1] = extraout_RDX_00[1];
                      uuid_00.Data4[2] = extraout_RDX_00[2];
                      uuid_00.Data4[3] = extraout_RDX_00[3];
                      uuid_00.Data4[4] = extraout_RDX_00[4];
                      uuid_00.Data4[5] = extraout_RDX_00[5];
                      uuid_00.Data4[6] = extraout_RDX_00[6];
                      uuid_00.Data4[7] = extraout_RDX_00[7];
                      uuid_00.Data1 = ud_header.m_classid.Data1;
                      uuid_00.Data2 = ud_header.m_classid.Data2;
                      uuid_00.Data3 = ud_header.m_classid.Data3;
                      local_168 = ON_ClassId::ClassId((ON_ClassId *)length_TCODE_ANONYMOUS_CHUNK,
                                                      uuid_00);
                    }
                    if (local_168 == (ON_ClassId *)0x0) {
                      local_168 = &ON_UnknownUserData::m_ON_UnknownUserData_class_rtti;
                    }
                  }
                  p = ON_ClassId::Create(local_168);
                  this_00 = ON_UserData::Cast(p);
                  if (((this_00 == (ON_UserData *)0x0) &&
                      (ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_archive.cpp"
                                  ,0x1610,"",
                                  "Reading object user data - unable to create userdata class"),
                      p != (ON_Object *)0x0)) && (p != (ON_Object *)0x0)) {
                    (*p->_vptr_ON_Object[4])();
                  }
                  if (this_00 == (ON_UserData *)0x0) {
                    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_archive.cpp"
                               ,0x1620,"",
                               "Unable to create object user data class. Flawed class id information."
                              );
                    local_4c = 2;
                  }
                  else {
                    bVar2 = ON_UuidIsNil(&this_00->m_application_uuid);
                    if (bVar2) {
                      bVar2 = ON_UuidIsNil((ON_UUID *)ud_header.m_itemid.Data4);
                      if (bVar2) {
                        iVar3 = Archive3dmVersion(this);
                        if (iVar3 == 2) {
                          ud_header.m_itemid.Data4 = (uchar  [8])0x494edb90132f2340;
                          ud_header.m_appid._0_8_ = (uchar  [8])0x7c19a30e6fc302bf;
                        }
                        else if (iVar3 == 3) {
                          ud_header.m_itemid.Data4 = (uchar  [8])0x478e6a9d4307b91d;
                          ud_header.m_appid._0_8_ = (uchar  [8])0x63c69779577ca2b0;
                        }
                        else if ((iVar3 == 4) &&
                                (uVar4 = ArchiveOpenNURBSVersion(this), uVar4 < 0xbf9a186)) {
                          ud_header.m_itemid.Data4 = (uchar  [8])0x44c2a244f73f2953;
                          ud_header.m_appid._0_8_ = (uchar  [8])0x96110d39277ec2b7;
                        }
                      }
                      *(uchar (*) [8])&this_00->m_application_uuid = ud_header.m_itemid.Data4;
                      *(undefined8 *)(this_00->m_application_uuid).Data4 = ud_header.m_appid._0_8_;
                    }
                    *(uchar (*) [8])&this_00->m_userdata_uuid = ud_header.m_classid.Data4;
                    *(undefined8 *)(this_00->m_userdata_uuid).Data4 = ud_header.m_itemid._0_8_;
                    this_00->m_userdata_copycount = ud_header.m_3dm_version;
                    (this_00->m_userdata_xform).m_xform[3][2] = ud_header.m_xform.m_xform[3][1];
                    (this_00->m_userdata_xform).m_xform[3][3] = ud_header.m_xform.m_xform[3][2];
                    (this_00->m_userdata_xform).m_xform[3][0] = ud_header.m_xform.m_xform[2][3];
                    (this_00->m_userdata_xform).m_xform[3][1] = ud_header.m_xform.m_xform[3][0];
                    (this_00->m_userdata_xform).m_xform[2][2] = ud_header.m_xform.m_xform[2][1];
                    (this_00->m_userdata_xform).m_xform[2][3] = ud_header.m_xform.m_xform[2][2];
                    (this_00->m_userdata_xform).m_xform[2][0] = ud_header.m_xform.m_xform[1][3];
                    (this_00->m_userdata_xform).m_xform[2][1] = ud_header.m_xform.m_xform[2][0];
                    (this_00->m_userdata_xform).m_xform[1][2] = ud_header.m_xform.m_xform[1][1];
                    (this_00->m_userdata_xform).m_xform[1][3] = ud_header.m_xform.m_xform[1][2];
                    (this_00->m_userdata_xform).m_xform[1][0] = ud_header.m_xform.m_xform[0][3];
                    (this_00->m_userdata_xform).m_xform[1][1] = ud_header.m_xform.m_xform[1][0];
                    (this_00->m_userdata_xform).m_xform[0][2] = ud_header.m_xform.m_xform[0][1];
                    (this_00->m_userdata_xform).m_xform[0][3] = ud_header.m_xform.m_xform[0][2];
                    (this_00->m_userdata_xform).m_xform[0][0] = (double)ud_header._56_8_;
                    (this_00->m_userdata_xform).m_xform[0][1] = ud_header.m_xform.m_xform[0][0];
                    bVar2 = ON_UserData::IsUnknownUserData(this_00);
                    if ((bVar2) &&
                       (pOVar6 = ON_UnknownUserData::Cast(&this_00->super_ON_Object),
                       pOVar6 != (ON_UnknownUserData *)0x0)) {
                      pOVar6->m_sizeof_buffer = (int)OStack_130;
                      (pOVar6->m_unknownclass_uuid).Data1 = (undefined4)length_TCODE_ANONYMOUS_CHUNK
                      ;
                      (pOVar6->m_unknownclass_uuid).Data2 = length_TCODE_ANONYMOUS_CHUNK._4_2_;
                      (pOVar6->m_unknownclass_uuid).Data3 = length_TCODE_ANONYMOUS_CHUNK._6_2_;
                      *(undefined8 *)(pOVar6->m_unknownclass_uuid).Data4 = ud_header.m_classid._0_8_
                      ;
                      pOVar6->m_3dm_version = ud_header.m_appid.Data4._0_4_;
                      pOVar6->m_3dm_opennurbs_version_number = ud_header.m_appid.Data4._4_4_;
                    }
                    this_00->m_userdata_owner = object;
                    bVar2 = ReadObjectUserDataAnonymousChunk
                                      (this,OStack_130,ud_header.m_appid.Data4._0_4_,
                                       ud_header.m_appid.Data4._4_4_,this_00);
                    this_00->m_userdata_owner = (ON_Object *)0x0;
                    if (bVar2) {
                      uVar4 = (*(this_00->super_ON_Object)._vptr_ON_Object[0x1c])
                                        (this_00,this,object);
                      if ((uVar4 & 1) == 0) {
                        bVar2 = ON_Object::AttachUserData(object,this_00);
                        if ((!bVar2) && (this_00 != (ON_UserData *)0x0)) {
                          (*(this_00->super_ON_Object)._vptr_ON_Object[4])();
                        }
                      }
                      else if (this_00 != (ON_UserData *)0x0) {
                        (*(this_00->super_ON_Object)._vptr_ON_Object[4])();
                      }
                    }
                    else if (this_00 != (ON_UserData *)0x0) {
                      (*(this_00->super_ON_Object)._vptr_ON_Object[4])();
                    }
                    local_4c = 0;
                  }
                }
                else {
                  ch.m_binary_archive._4_1_ = 1;
                  local_4c = 2;
                }
              }
            }
            else {
              ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_archive.cpp"
                         ,0x15cb,"","Unable to read user data header information.");
              local_4c = 3;
            }
          }
        }
        else {
          ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_archive.cpp"
                     ,0x15bd,"",
                     "Unable to read TCODE_OPENNURBS_CLASS_USERDATA chunk version numbers");
          local_4c = 3;
        }
      }
    }
    else if ((int)ch.m_binary_archive == 0) {
      ch._39_1_ = 0;
      local_4c = 3;
    }
    else {
      local_4c = 2;
    }
    ON_ReadChunkHelper::~ON_ReadChunkHelper((ON_ReadChunkHelper *)local_48);
  } while ((local_4c == 0) || (local_4c == 2));
  if ((ch._38_1_ & 1) == 0) {
    ch._39_1_ = 0;
  }
  return (bool)(ch._39_1_ & 1);
}

Assistant:

bool ON_BinaryArchive::ReadObjectUserData( ON_Object& object )
{
  bool rc = true;
  bool bChunkReadSuccess = true;
  while(rc && bChunkReadSuccess) 
  {
    // Note:
    //  The destructor ~ON_ReadChunkHelper() may set bChunkReadSuccess
    //  An example of this case occures when reading the corrupt file
    //  attached to bug report RH-22547.
    ON_ReadChunkHelper ch(*this,bChunkReadSuccess);
    if ( !bChunkReadSuccess )
    {
      rc = false;
      break;
    }

    if ( TCODE_OPENNURBS_CLASS_END == ch.m_chunk_tcode )
    {
      // A short TCODE_OPENNURBS_CLASS_END chunk marks the end of the opennurbs class
      break; // done
    }

    if ( TCODE_OPENNURBS_CLASS_USERDATA != ch.m_chunk_tcode )
    {
      if ( 0 == ch.m_chunk_tcode )
      {
        // A short TCODE_OPENNURBS_CLASS_END chunk marks the end of the opennurbs class
        // Checking for zero here fixes RH-22547 which was a report of Rescue3dm taking
        // hours to read a damaged file that was filled with large blocks of zeros 
        // caused by some form of storage media or tranmission corruption.
        rc = false; // there should never be a typecode of zero.
        break;
      }

      // skip new chunk type added by later version
      continue;
    }

    if ( ch.m_chunk_value < (ON__INT64)(8 + 4 * SizeofChunkLength()) )
    {
      ON_ERROR("TCODE_OPENNURBS_CLASS_USERDATA chunk is too short");
      continue;
    }

    // Read userdata header information
    int major_userdata_version = 0;
    int minor_userdata_version = 0;
    rc = Read3dmChunkVersion( &major_userdata_version, &minor_userdata_version );
    if ( !rc )
    {
      ON_ERROR("Unable to read TCODE_OPENNURBS_CLASS_USERDATA chunk version numbers");
      break;
    }

    if ( major_userdata_version < 1 || major_userdata_version > 2 )
    {
      // unsupported version - too old or added in new version
      continue;
    }

    CUserDataHeaderInfo ud_header;
    rc = ReadObjectUserDataHeaderHelper(*this,major_userdata_version,minor_userdata_version,ud_header);
    if (!rc)
    {
      ON_ERROR("Unable to read user data header information.");
      break;
    }

    // we should be ready to read a TCODE_ANONYMOUS_CHUNK containing userdata
    ON__INT64 length_TCODE_ANONYMOUS_CHUNK = 0;
    for(;;)
    {
      ON__UINT32 t = 0;
      rc = PeekAt3dmBigChunkType( &t, &length_TCODE_ANONYMOUS_CHUNK );
      if (!rc)
        break;
      if ( t != TCODE_ANONYMOUS_CHUNK )
      {
        ON_ERROR("Reading object user data - unable to find TCODE_ANONYMOUS_CHUNK");
        rc = false;
        break;
      }
      if ( length_TCODE_ANONYMOUS_CHUNK < 4 )
      {
        ON_ERROR("Reading object user data - length of TCODE_ANONYMOUS_CHUNK < 4");
        rc = false;
        break;
      }
      break;
    }
    if (!rc)
    {
      break;
    }

    if (false == ShouldSerializeUserDataItem(ud_header.m_appid, ud_header.m_itemid))
    {
      ch.m_bSupressPartiallyReadChunkWarning = true;
      continue;
    }

    // attempt to get an instance of the userdata class that saved this information
    ON_UserData* ud = 0;
    for(;;)
    {
      const ON_ClassId* udId = ON_ClassId::ClassId( ud_header.m_classid );
      if ( 0 == udId ) 
      {
        // The application that created this userdata is not active
        if ( !ON_UuidIsNil(ud_header.m_appid) )
        {
          // see if we can load the application
          if ( 1 == LoadUserDataApplication(ud_header.m_appid) )
          {
            // try again
            udId = ON_ClassId::ClassId( ud_header.m_classid );
          }
        }

        if ( 0 == udId )
        {
          // The application that created this user data is
          // not available.  This information will be stored
          // in an ON_UnknownUserData class so that it can
          // persist.
          udId = &ON_CLASS_RTTI(ON_UnknownUserData);
        }
      }

      ON_Object* tmp = udId->Create();
      ud = ON_UserData::Cast(tmp);
      if ( 0 == ud )
      {
        ON_ERROR("Reading object user data - unable to create userdata class");
        if ( tmp )
          delete tmp;
        tmp = 0;
        break;
      }
      tmp = 0;

      break;
    }

    if ( 0 == ud )
    {
      // no luck on this one 
      // One reason can be that the plug-in userdata class has something wrong with 
      // its ON_OBJECT_DECLARE/ON_OBJECT_IMPLEMENT stuff.
      ON_ERROR("Unable to create object user data class. Flawed class id information.");
      continue; // keep trying
    }

    if ( ON_UuidIsNil(ud->m_application_uuid) )
    {
      if ( ON_UuidIsNil(ud_header.m_appid) )
      {
        switch( Archive3dmVersion())
        {
        case 2:
          // V2 archives do not contain app ids.
          // This id flags the userdata as being read from a V3 archive.
          ud_header.m_appid = ON_v2_userdata_id;
          break;
        case 3:
          // V3 archives do not contain app ids.
          // This id flags the userdata as being
          // read from a V3 archive.
          ud_header.m_appid = ON_v3_userdata_id;
          break;
        case 4:
          if ( ArchiveOpenNURBSVersion() < 200909190 )
          {
            // V4 archives before version 200909190
            // did not require user data application ids.
            ud_header.m_appid = ON_v4_userdata_id;
          }
          break;
        }
      }
      ud->m_application_uuid = ud_header.m_appid;
    }
    ud->m_userdata_uuid = ud_header.m_itemid;
    ud->m_userdata_copycount = ud_header.m_copycount;
    ud->m_userdata_xform = ud_header.m_xform;
    if ( ud->IsUnknownUserData() ) 
    {
      ON_UnknownUserData* uud = ON_UnknownUserData::Cast(ud);
      if ( uud ) 
      {
        uud->m_sizeof_buffer = (int)length_TCODE_ANONYMOUS_CHUNK;
        uud->m_unknownclass_uuid = ud_header.m_classid;
        uud->m_3dm_version = ud_header.m_3dm_version;
        uud->m_3dm_opennurbs_version_number = ud_header.m_3dm_opennurbs_version_number;
      }
    }
    ud->m_userdata_owner = &object; // so reading code can look at owner
    bool bReadUserData = ReadObjectUserDataAnonymousChunk(
              length_TCODE_ANONYMOUS_CHUNK,
              ud_header.m_3dm_version,
              ud_header.m_3dm_opennurbs_version_number,
              ud
              );
    ud->m_userdata_owner = 0;
    if (bReadUserData)
    {
      if (ud->DeleteAfterRead(*this,&object))
      {
        // obsolete user data
        delete ud;
      }
      else if (!object.AttachUserData(ud))
      {
        // attach failed
        delete ud;
      }
    }
    else
    {
      delete ud;
    }    
  }

  if ( !bChunkReadSuccess )
    rc = false;

  return rc;
}